

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O0

err_t bign96ParamsVal(bign_params *params)

{
  bool_t bVar1;
  int iVar2;
  word *a;
  void *src;
  size_t sVar3;
  ec_o *ec_00;
  qr_o *in_RDI;
  word *unaff_retaddr;
  word *in_stack_00000008;
  word *in_stack_00000010;
  octet *stack;
  word *B;
  octet *hash_data;
  octet *hash_state;
  ec_o *ec;
  void *state;
  size_t n;
  err_t code;
  size_t in_stack_ffffffffffffff98;
  void *in_stack_ffffffffffffffa0;
  void **dest;
  size_t in_stack_ffffffffffffffa8;
  void *stack_00;
  void **a_00;
  ec_o *b;
  void *n_00;
  bign_params *in_stack_ffffffffffffffd0;
  word *stack_01;
  bign96_deep_i in_stack_ffffffffffffffe0;
  size_t m;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  err_t eVar4;
  
  bVar1 = memIsValid(in_RDI,0x150);
  if (bVar1 == 0) {
    eVar4 = 0x6d;
  }
  else if ((in_RDI->hdr).keep == 0x60) {
    bign96Start_keep(in_stack_ffffffffffffffe0);
    a = (word *)blobCreate(in_stack_ffffffffffffff98);
    if (a == (word *)0x0) {
      eVar4 = 0x6e;
    }
    else {
      eVar4 = bign96Start(a,in_stack_ffffffffffffffd0);
      if (eVar4 == 0) {
        m = *(size_t *)(a[3] + 0x30);
        src = (void *)((long)a + *a);
        stack_00 = src;
        stack_01 = a;
        sVar3 = beltHash_keep();
        ec_00 = (ec_o *)((long)src + sVar3);
        dest = &ec_00->params;
        b = ec_00;
        beltHashStart(in_stack_ffffffffffffffa0);
        beltHashStepH(dest,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        beltHashStepH(dest,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
        a_00 = dest;
        n_00 = stack_00;
        beltHash_keep();
        memCopy(dest,src,0x153e4d);
        memCopy(dest,src,0x153e68);
        beltHashStepH(a_00,(size_t)stack_00,dest);
        u64From((u64 *)dest,src,0x153e90);
        zzAddW2((word *)ec_00,1,1);
        u64To(dest,(size_t)src,(u64 *)0x153eb6);
        beltHashStepH(a_00,(size_t)stack_00,dest);
        beltHashStepG((octet *)dest,src);
        beltHashStepG((octet *)dest,src);
        u64From((u64 *)dest,src,0x153f00);
        zzMod(unaff_retaddr,(word *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
              (size_t)in_RDI,(word *)CONCAT44(eVar4,in_stack_ffffffffffffffe8),m,stack_01);
        u64To(dest,(size_t)src,(u64 *)0x153f3f);
        iVar2 = (**(code **)(a[3] + 0x40))(ec_00,ec_00,a[3],a_00);
        if (((((iVar2 == 0) || (bVar1 = wwEq((word *)ec_00,(word *)a[5],m), bVar1 == 0)) ||
             (bVar1 = wwIsZero((word *)a[5],m), bVar1 != 0)) ||
            ((bVar1 = ecpIsValid(ec_00,a_00), bVar1 == 0 ||
             (bVar1 = ecpIsSafeGroup(ec_00,(size_t)a_00,stack_00), bVar1 == 0)))) ||
           (iVar2 = zzJacobi(a,(size_t)n_00,(word *)b,(size_t)ec_00,a_00), iVar2 != 1)) {
          eVar4 = 0x1f6;
        }
        else {
          wwCopy((word *)ec_00,*(word **)(a[3] + 0x18),m);
          zzAddW2((word *)ec_00,m,1);
          wwShLo((word *)a_00,(size_t)stack_00,(size_t)dest);
          qrPower(in_stack_00000010,in_stack_00000008,unaff_retaddr,
                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                  (void *)CONCAT44(eVar4,in_stack_ffffffffffffffe8));
          bVar1 = wwEq((word *)ec_00,(word *)(a[6] + m * 8),m);
          if ((bVar1 == 0) ||
             (bVar1 = ecHasOrderA((word *)b,ec_00,(word *)a_00,(size_t)stack_00,dest), bVar1 == 0))
          {
            eVar4 = 0x1f6;
          }
        }
        blobClose((blob_t)0x1540f3);
      }
      else {
        blobClose((blob_t)0x153d74);
      }
    }
  }
  else {
    eVar4 = 0x1f6;
  }
  return eVar4;
}

Assistant:

err_t bign96ParamsVal(const bign_params* params)
{
	err_t code;
	size_t n;
	// состояние (буферы могут пересекаться)
	void* state;
	ec_o* ec;				/* описание эллиптической кривой */
	octet* hash_state;		/* [beltHash_keep] состояние хэширования */
	octet* hash_data;		/* [8] данные хэширования */
	word* B;				/* [W_OF_B(512)] переменная B */
	octet* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96ParamsVal_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// раскладка состояния
	hash_state = objEnd(ec, octet);
	hash_data = hash_state + beltHash_keep();
	B = (word*)hash_data;
	stack = hash_data + O_OF_B(512);
	// belt-hash(p..)
	beltHashStart(hash_state);
	beltHashStepH(params->p, 24, hash_state);
	// belt-hash(..a..)
	beltHashStepH(params->a, 24, hash_state);
	memCopy(stack, hash_state, beltHash_keep());
	// belt-hash(..seed)
	memCopy(hash_data, params->seed, 8);
	beltHashStepH(hash_data, 8, hash_state);
	// belt-hash(..seed + 1)
	wwFrom(B, hash_data, 8);
	zzAddW2(B, W_OF_O(8), 1);
	wwTo(hash_data, 8, B);
	beltHashStepH(hash_data, 8, stack);
	// B <- belt-hash(p || a || seed) || belt-hash(p || a || seed + 1)
	beltHashStepG(hash_data, hash_state);
	beltHashStepG(hash_data + 32, stack);
	wwFrom(B, hash_data, 64);
	// B <- B \mod p
	zzMod(B, B, W_OF_O(64), ec->f->mod, n, stack);
	wwTo(B, 64, B);
	// проверить условия алгоритма 6.1.4
	if (qrFrom(B, (octet*)B, ec->f, stack) &&
		wwEq(B, ec->B, n) &&
		!wwIsZero(ec->B, n) &&
		ecpIsValid(ec, stack) &&
		ecpIsSafeGroup(ec, 50, stack) &&
		zzJacobi(ec->B, n, ec->f->mod, n, stack) == 1)
	{
		// B <- b^{(p + 1) / 4} = \sqrt{b} mod p
		wwCopy(B, ec->f->mod, n);
		zzAddW2(B, n, 1);
		wwShLo(B, n, 2);
		qrPower(B, ec->B, B, n, ec->f, stack);
		// оставшиеся условия
		if (!wwEq(B, ecY(ec->base, n), n) ||
			!ecHasOrderA(ec->base, ec, ec->order, n, stack))
			code = ERR_BAD_PARAMS;
	}
	else
		code = ERR_BAD_PARAMS;
	// завершение
	blobClose(state);
	return code;
}